

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void __thiscall Fossilize::FeatureFilter::Impl::init_features(Impl *this,void *pNext)

{
  VkStructureType VVar1;
  undefined4 uVar2;
  VkPhysicalDeviceVulkan14Features *vk14;
  VkPhysicalDeviceVulkan13Features *vk13;
  VkPhysicalDeviceVulkan12Features *vk12;
  VkPhysicalDeviceVulkan11Features *vk11;
  VkBaseInStructure *base;
  void *pNext_local;
  Impl *this_local;
  
  for (base = (VkBaseInStructure *)pNext; base != (VkBaseInStructure *)0x0; base = base->pNext) {
    VVar1 = base->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_FEATURES) {
      if (base[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).storage_16bit.storageBuffer16BitAccess = 1;
      }
      if (*(int *)&base[1].field_0x4 != 0) {
        (this->features).storage_16bit.uniformAndStorageBuffer16BitAccess = 1;
      }
      if (*(int *)&base[1].pNext != 0) {
        (this->features).storage_16bit.storagePushConstant16 = 1;
      }
      if (*(int *)((long)&base[1].pNext + 4) != 0) {
        (this->features).storage_16bit.storageInputOutput16 = 1;
      }
      if (base[2].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).multiview.multiview = 1;
      }
      if (*(int *)&base[2].field_0x4 != 0) {
        (this->features).multiview.multiviewGeometryShader = 1;
      }
      if (*(int *)&base[2].pNext != 0) {
        (this->features).multiview.multiviewTessellationShader = 1;
      }
      if (*(int *)((long)&base[2].pNext + 4) != 0) {
        (this->features).variable_pointers.variablePointersStorageBuffer = 1;
      }
      if (base[3].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).variable_pointers.variablePointers = 1;
      }
      if (*(int *)&base[3].pNext != 0) {
        (this->features).ycbcr_conversion.samplerYcbcrConversion = 1;
      }
      if (*(int *)((long)&base[3].pNext + 4) != 0) {
        (this->features).draw_parameters.shaderDrawParameters = 1;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES) {
      if (*(int *)&base[1].pNext != 0) {
        (this->features).storage_8bit.storageBuffer8BitAccess = 1;
      }
      if (*(int *)((long)&base[1].pNext + 4) != 0) {
        (this->features).storage_8bit.uniformAndStorageBuffer8BitAccess = 1;
      }
      if (base[2].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).storage_8bit.storagePushConstant8 = 1;
      }
      if (*(int *)&base[2].field_0x4 != 0) {
        (this->features).atomic_int64.shaderBufferInt64Atomics = 1;
      }
      if (*(int *)&base[2].pNext != 0) {
        (this->features).atomic_int64.shaderSharedInt64Atomics = 1;
      }
      if (*(int *)((long)&base[2].pNext + 4) != 0) {
        (this->features).float16_int8.shaderFloat16 = 1;
      }
      if (base[3].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).float16_int8.shaderInt8 = 1;
      }
      if (*(int *)&base[3].field_0x4 != 0) {
        (this->features).vk12.descriptorIndexing = 1;
      }
      if (*(int *)&base[3].pNext != 0) {
        (this->features).descriptor_indexing.shaderInputAttachmentArrayDynamicIndexing = 1;
      }
      if (*(int *)((long)&base[3].pNext + 4) != 0) {
        (this->features).descriptor_indexing.shaderUniformTexelBufferArrayDynamicIndexing = 1;
      }
      if (base[4].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).descriptor_indexing.shaderStorageTexelBufferArrayDynamicIndexing = 1;
      }
      if (*(int *)&base[4].field_0x4 != 0) {
        (this->features).descriptor_indexing.shaderUniformBufferArrayNonUniformIndexing = 1;
      }
      if (*(int *)&base[4].pNext != 0) {
        (this->features).descriptor_indexing.shaderSampledImageArrayNonUniformIndexing = 1;
      }
      if (*(int *)((long)&base[4].pNext + 4) != 0) {
        (this->features).descriptor_indexing.shaderStorageBufferArrayNonUniformIndexing = 1;
      }
      if (base[5].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).descriptor_indexing.shaderStorageImageArrayNonUniformIndexing = 1;
      }
      if (*(int *)&base[5].field_0x4 != 0) {
        (this->features).descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexing = 1;
      }
      if (*(int *)&base[5].pNext != 0) {
        (this->features).descriptor_indexing.shaderUniformTexelBufferArrayNonUniformIndexing = 1;
      }
      if (*(int *)((long)&base[5].pNext + 4) != 0) {
        (this->features).descriptor_indexing.shaderStorageTexelBufferArrayNonUniformIndexing = 1;
      }
      if (base[6].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind = 1;
      }
      if (*(int *)&base[6].field_0x4 != 0) {
        (this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind = 1;
      }
      if (*(int *)&base[6].pNext != 0) {
        (this->features).descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind = 1;
      }
      if (*(int *)((long)&base[6].pNext + 4) != 0) {
        (this->features).descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind = 1;
      }
      if (base[7].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind = 1;
      }
      if (*(int *)&base[7].field_0x4 != 0) {
        (this->features).descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind = 1;
      }
      if (*(int *)&base[7].pNext != 0) {
        (this->features).descriptor_indexing.descriptorBindingUpdateUnusedWhilePending = 1;
      }
      if (*(int *)((long)&base[7].pNext + 4) != 0) {
        (this->features).descriptor_indexing.descriptorBindingPartiallyBound = 1;
      }
      if (base[8].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).descriptor_indexing.descriptorBindingVariableDescriptorCount = 1;
      }
      if (*(int *)&base[8].field_0x4 != 0) {
        (this->features).descriptor_indexing.runtimeDescriptorArray = 1;
      }
      if (*(int *)&base[8].pNext != 0) {
        (this->features).vk12.samplerFilterMinmax = 1;
      }
      if (*(int *)((long)&base[8].pNext + 4) != 0) {
        (this->features).vk12.scalarBlockLayout = 1;
      }
      if (*(int *)&base[9].pNext != 0) {
        (this->features).subgroup_extended_types.shaderSubgroupExtendedTypes = 1;
      }
      if (*(int *)((long)&base[9].pNext + 4) != 0) {
        (this->features).separate_ds_layout.separateDepthStencilLayouts = 1;
      }
      if (*(int *)&base[10].pNext != 0) {
        (this->features).buffer_device_address.bufferDeviceAddress = 1;
      }
      if (*(int *)((long)&base[10].pNext + 4) != 0) {
        (this->features).buffer_device_address.bufferDeviceAddressCaptureReplay = 1;
      }
      if (base[0xb].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).buffer_device_address.bufferDeviceAddressMultiDevice = 1;
      }
      if (*(int *)&base[0xb].field_0x4 != 0) {
        (this->features).memory_model.vulkanMemoryModel = 1;
      }
      if (*(int *)&base[0xb].pNext != 0) {
        (this->features).memory_model.vulkanMemoryModelDeviceScope = 1;
      }
      if (*(int *)((long)&base[0xb].pNext + 4) != 0) {
        (this->features).memory_model.vulkanMemoryModelAvailabilityVisibilityChains = 1;
      }
      if (base[0xc].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).vk12.shaderOutputViewportIndex = 1;
      }
      if (*(int *)&base[0xc].field_0x4 != 0) {
        (this->features).vk12.shaderOutputLayer = 1;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES) {
      if (base[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).image_robustness.robustImageAccess = 1;
      }
      if (*(int *)&base[1].field_0x4 != 0) {
        (this->features).inline_uniform_block.inlineUniformBlock = 1;
      }
      if (*(int *)&base[1].pNext != 0) {
        (this->features).inline_uniform_block.descriptorBindingInlineUniformBlockUpdateAfterBind = 1
        ;
      }
      if (*(int *)&base[2].field_0x4 != 0) {
        (this->features).demote_to_helper.shaderDemoteToHelperInvocation = 1;
      }
      if (*(int *)&base[2].pNext != 0) {
        (this->features).vk13.shaderTerminateInvocation = 1;
      }
      if (*(int *)((long)&base[2].pNext + 4) != 0) {
        (this->features).subgroup_size_control.subgroupSizeControl = 1;
      }
      if (base[3].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).subgroup_size_control.computeFullSubgroups = 1;
      }
      if (*(int *)&base[3].field_0x4 != 0) {
        (this->features).synchronization2.synchronization2 = 1;
      }
      if (*(int *)((long)&base[3].pNext + 4) != 0) {
        (this->features).zero_initialize_workgroup_memory.shaderZeroInitializeWorkgroupMemory = 1;
      }
      if (base[4].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).dynamic_rendering.dynamicRendering = 1;
      }
      if (*(int *)&base[4].field_0x4 != 0) {
        (this->features).shader_integer_dot_product.shaderIntegerDotProduct = 1;
      }
      if (*(int *)&base[4].pNext != 0) {
        (this->features).maintenance4.maintenance4 = 1;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_4_FEATURES) {
      if (*(int *)&base[4].pNext != 0) {
        (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead = 1;
      }
      if (*(int *)&base[1].field_0x4 != 0) {
        (this->features).shader_subgroup_rotate.shaderSubgroupRotate = 1;
      }
      if (*(int *)&base[1].pNext != 0) {
        (this->features).shader_subgroup_rotate.shaderSubgroupRotateClustered = 1;
      }
      if (*(int *)((long)&base[1].pNext + 4) != 0) {
        (this->features).shader_float_controls2.shaderFloatControls2 = 1;
      }
      if (base[2].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).expect_assume.shaderExpectAssume = 1;
      }
      if (*(int *)&base[2].field_0x4 != 0) {
        (this->features).line_rasterization.rectangularLines = 1;
      }
      if (*(int *)&base[2].pNext != 0) {
        (this->features).line_rasterization.bresenhamLines = 1;
      }
      if (*(int *)((long)&base[2].pNext + 4) != 0) {
        (this->features).line_rasterization.smoothLines = 1;
      }
      if (base[3].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).line_rasterization.stippledRectangularLines = 1;
      }
      if (*(int *)&base[3].field_0x4 != 0) {
        (this->features).line_rasterization.stippledBresenhamLines = 1;
      }
      if (*(int *)&base[3].pNext != 0) {
        (this->features).line_rasterization.stippledSmoothLines = 1;
      }
      if (*(int *)((long)&base[3].pNext + 4) != 0) {
        (this->features).attribute_divisor.vertexAttributeInstanceRateDivisor = 1;
      }
      if (base[4].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).attribute_divisor.vertexAttributeInstanceRateZeroDivisor = 1;
      }
      if (*(int *)((long)&base[4].pNext + 4) != 0) {
        (this->features).maintenance5.maintenance5 = 1;
      }
      if (*(int *)&base[5].field_0x4 != 0) {
        (this->features).pipeline_protected_access.pipelineProtectedAccess = 1;
      }
      if (*(int *)&base[5].pNext != 0) {
        (this->features).pipeline_robustness.pipelineRobustness = 1;
      }
      if (base[6].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        (this->features).vk14.pushDescriptor = 1;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_TRANSFORM_FEEDBACK_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).transform_feedback.sType = base->sType;
      *(undefined4 *)&(this->features).transform_feedback.field_0x4 = uVar2;
      (this->features).transform_feedback.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).transform_feedback.transformFeedback = base[1].sType;
      (this->features).transform_feedback.geometryStreams = uVar2;
      (this->features).transform_feedback.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).dynamic_rendering.sType = base->sType;
      *(undefined4 *)&(this->features).dynamic_rendering.field_0x4 = uVar2;
      (this->features).dynamic_rendering.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).dynamic_rendering.dynamicRendering = base[1].sType;
      *(undefined4 *)&(this->features).dynamic_rendering.field_0x14 = uVar2;
      (this->features).dynamic_rendering.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTIVIEW_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).multiview.sType = base->sType;
      *(undefined4 *)&(this->features).multiview.field_0x4 = uVar2;
      (this->features).multiview.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).multiview.multiview = base[1].sType;
      (this->features).multiview.multiviewGeometryShader = uVar2;
      *(VkBaseInStructure **)&(this->features).multiview.multiviewTessellationShader = base[1].pNext
      ;
      (this->features).multiview.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_DRAW_PARAMETERS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).draw_parameters.sType = base->sType;
      *(undefined4 *)&(this->features).draw_parameters.field_0x4 = uVar2;
      (this->features).draw_parameters.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).draw_parameters.shaderDrawParameters = base[1].sType;
      *(undefined4 *)&(this->features).draw_parameters.field_0x14 = uVar2;
      (this->features).draw_parameters.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_ROBUSTNESS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).pipeline_robustness.sType = base->sType;
      *(undefined4 *)&(this->features).pipeline_robustness.field_0x4 = uVar2;
      (this->features).pipeline_robustness.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).pipeline_robustness.pipelineRobustness = base[1].sType;
      *(undefined4 *)&(this->features).pipeline_robustness.field_0x14 = uVar2;
      (this->features).pipeline_robustness.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_CONDITIONAL_RENDERING_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).conditional_rendering.sType = base->sType;
      *(undefined4 *)&(this->features).conditional_rendering.field_0x4 = uVar2;
      (this->features).conditional_rendering.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).conditional_rendering.conditionalRendering = base[1].sType;
      (this->features).conditional_rendering.inheritedConditionalRendering = uVar2;
      (this->features).conditional_rendering.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FLOAT16_INT8_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).float16_int8.sType = base->sType;
      *(undefined4 *)&(this->features).float16_int8.field_0x4 = uVar2;
      (this->features).float16_int8.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).float16_int8.shaderFloat16 = base[1].sType;
      (this->features).float16_int8.shaderInt8 = uVar2;
      (this->features).float16_int8.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_16BIT_STORAGE_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).storage_16bit.sType = base->sType;
      *(undefined4 *)&(this->features).storage_16bit.field_0x4 = uVar2;
      (this->features).storage_16bit.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).storage_16bit.storageBuffer16BitAccess = base[1].sType;
      (this->features).storage_16bit.uniformAndStorageBuffer16BitAccess = uVar2;
      *(VkBaseInStructure **)&(this->features).storage_16bit.storagePushConstant16 = base[1].pNext;
      (this->features).storage_16bit.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLIP_ENABLE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).depth_clip.sType = base->sType;
      *(undefined4 *)&(this->features).depth_clip.field_0x4 = uVar2;
      (this->features).depth_clip.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).depth_clip.depthClipEnable = base[1].sType;
      *(undefined4 *)&(this->features).depth_clip.field_0x14 = uVar2;
      (this->features).depth_clip.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VARIABLE_POINTERS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).variable_pointers.sType = base->sType;
      *(undefined4 *)&(this->features).variable_pointers.field_0x4 = uVar2;
      (this->features).variable_pointers.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).variable_pointers.variablePointersStorageBuffer = base[1].sType;
      (this->features).variable_pointers.variablePointers = uVar2;
      (this->features).variable_pointers.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_INLINE_UNIFORM_BLOCK_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).inline_uniform_block.sType = base->sType;
      *(undefined4 *)&(this->features).inline_uniform_block.field_0x4 = uVar2;
      (this->features).inline_uniform_block.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).inline_uniform_block.inlineUniformBlock = base[1].sType;
      (this->features).inline_uniform_block.descriptorBindingInlineUniformBlockUpdateAfterBind =
           uVar2;
      (this->features).inline_uniform_block.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BLEND_OPERATION_ADVANCED_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).blend_operation_advanced.sType = base->sType;
      *(undefined4 *)&(this->features).blend_operation_advanced.field_0x4 = uVar2;
      (this->features).blend_operation_advanced.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).blend_operation_advanced.advancedBlendCoherentOperations = base[1].sType;
      *(undefined4 *)&(this->features).blend_operation_advanced.field_0x14 = uVar2;
      (this->features).blend_operation_advanced.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ACCELERATION_STRUCTURE_FEATURES_KHR) {
      memcpy(&(this->features).acceleration_structure,base,0x28);
      (this->features).acceleration_structure.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SM_BUILTINS_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).sm_builtins_nv.sType = base->sType;
      *(undefined4 *)&(this->features).sm_builtins_nv.field_0x4 = uVar2;
      (this->features).sm_builtins_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).sm_builtins_nv.shaderSMBuiltins = base[1].sType;
      *(undefined4 *)&(this->features).sm_builtins_nv.field_0x14 = uVar2;
      (this->features).sm_builtins_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SAMPLER_YCBCR_CONVERSION_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).ycbcr_conversion.sType = base->sType;
      *(undefined4 *)&(this->features).ycbcr_conversion.field_0x4 = uVar2;
      (this->features).ycbcr_conversion.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).ycbcr_conversion.samplerYcbcrConversion = base[1].sType;
      *(undefined4 *)&(this->features).ycbcr_conversion.field_0x14 = uVar2;
      (this->features).ycbcr_conversion.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES) {
      memcpy(&(this->features).descriptor_indexing,base,0x60);
      (this->features).descriptor_indexing.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADING_RATE_IMAGE_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shading_rate_nv.sType = base->sType;
      *(undefined4 *)&(this->features).shading_rate_nv.field_0x4 = uVar2;
      (this->features).shading_rate_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shading_rate_nv.shadingRateImage = base[1].sType;
      (this->features).shading_rate_nv.shadingRateCoarseSampleOrder = uVar2;
      (this->features).shading_rate_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SUBGROUP_EXTENDED_TYPES_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).subgroup_extended_types.sType = base->sType;
      *(undefined4 *)&(this->features).subgroup_extended_types.field_0x4 = uVar2;
      (this->features).subgroup_extended_types.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).subgroup_extended_types.shaderSubgroupExtendedTypes = base[1].sType;
      *(undefined4 *)&(this->features).subgroup_extended_types.field_0x14 = uVar2;
      (this->features).subgroup_extended_types.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_8BIT_STORAGE_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).storage_8bit.sType = base->sType;
      *(undefined4 *)&(this->features).storage_8bit.field_0x4 = uVar2;
      (this->features).storage_8bit.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).storage_8bit.storageBuffer8BitAccess = base[1].sType;
      (this->features).storage_8bit.uniformAndStorageBuffer8BitAccess = uVar2;
      *(VkBaseInStructure **)&(this->features).storage_8bit.storagePushConstant8 = base[1].pNext;
      (this->features).storage_8bit.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_INT64_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).atomic_int64.sType = base->sType;
      *(undefined4 *)&(this->features).atomic_int64.field_0x4 = uVar2;
      (this->features).atomic_int64.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).atomic_int64.shaderBufferInt64Atomics = base[1].sType;
      (this->features).atomic_int64.shaderSharedInt64Atomics = uVar2;
      (this->features).atomic_int64.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_CLOCK_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_clock.sType = base->sType;
      *(undefined4 *)&(this->features).shader_clock.field_0x4 = uVar2;
      (this->features).shader_clock.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_clock.shaderSubgroupClock = base[1].sType;
      (this->features).shader_clock.shaderDeviceClock = uVar2;
      (this->features).shader_clock.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_ATTRIBUTE_DIVISOR_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).attribute_divisor.sType = base->sType;
      *(undefined4 *)&(this->features).attribute_divisor.field_0x4 = uVar2;
      (this->features).attribute_divisor.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).attribute_divisor.vertexAttributeInstanceRateDivisor = base[1].sType;
      (this->features).attribute_divisor.vertexAttributeInstanceRateZeroDivisor = uVar2;
      (this->features).attribute_divisor.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COMPUTE_SHADER_DERIVATIVES_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).compute_shader_derivatives.sType = base->sType;
      *(undefined4 *)&(this->features).compute_shader_derivatives.field_0x4 = uVar2;
      (this->features).compute_shader_derivatives.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).compute_shader_derivatives.computeDerivativeGroupQuads = base[1].sType;
      (this->features).compute_shader_derivatives.computeDerivativeGroupLinear = uVar2;
      (this->features).compute_shader_derivatives.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).mesh_shader_nv.sType = base->sType;
      *(undefined4 *)&(this->features).mesh_shader_nv.field_0x4 = uVar2;
      (this->features).mesh_shader_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).mesh_shader_nv.taskShader = base[1].sType;
      (this->features).mesh_shader_nv.meshShader = uVar2;
      (this->features).mesh_shader_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADER_BARYCENTRIC_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).barycentric.sType = base->sType;
      *(undefined4 *)&(this->features).barycentric.field_0x4 = uVar2;
      (this->features).barycentric.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).barycentric.fragmentShaderBarycentric = base[1].sType;
      *(undefined4 *)&(this->features).barycentric.field_0x14 = uVar2;
      (this->features).barycentric.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_IMAGE_FOOTPRINT_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).image_footprint_nv.sType = base->sType;
      *(undefined4 *)&(this->features).image_footprint_nv.field_0x4 = uVar2;
      (this->features).image_footprint_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).image_footprint_nv.imageFootprint = base[1].sType;
      *(undefined4 *)&(this->features).image_footprint_nv.field_0x14 = uVar2;
      (this->features).image_footprint_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_INTEGER_FUNCTIONS_2_FEATURES_INTEL) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).integer_functions2_intel.sType = base->sType;
      *(undefined4 *)&(this->features).integer_functions2_intel.field_0x4 = uVar2;
      (this->features).integer_functions2_intel.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).integer_functions2_intel.shaderIntegerFunctions2 = base[1].sType;
      *(undefined4 *)&(this->features).integer_functions2_intel.field_0x14 = uVar2;
      (this->features).integer_functions2_intel.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_MEMORY_MODEL_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).memory_model.sType = base->sType;
      *(undefined4 *)&(this->features).memory_model.field_0x4 = uVar2;
      (this->features).memory_model.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).memory_model.vulkanMemoryModel = base[1].sType;
      (this->features).memory_model.vulkanMemoryModelDeviceScope = uVar2;
      *(VkBaseInStructure **)
       &(this->features).memory_model.vulkanMemoryModelAvailabilityVisibilityChains = base[1].pNext;
      (this->features).memory_model.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_DENSITY_MAP_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).fragment_density.sType = base->sType;
      *(undefined4 *)&(this->features).fragment_density.field_0x4 = uVar2;
      (this->features).fragment_density.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).fragment_density.fragmentDensityMap = base[1].sType;
      (this->features).fragment_density.fragmentDensityMapDynamic = uVar2;
      *(VkBaseInStructure **)
       &(this->features).fragment_density.fragmentDensityMapNonSubsampledImages = base[1].pNext;
      (this->features).fragment_density.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_SIZE_CONTROL_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).subgroup_size_control.sType = base->sType;
      *(undefined4 *)&(this->features).subgroup_size_control.field_0x4 = uVar2;
      (this->features).subgroup_size_control.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).subgroup_size_control.subgroupSizeControl = base[1].sType;
      (this->features).subgroup_size_control.computeFullSubgroups = uVar2;
      (this->features).subgroup_size_control.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).fragment_shading_rate.sType = base->sType;
      *(undefined4 *)&(this->features).fragment_shading_rate.field_0x4 = uVar2;
      (this->features).fragment_shading_rate.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).fragment_shading_rate.pipelineFragmentShadingRate = base[1].sType;
      (this->features).fragment_shading_rate.primitiveFragmentShadingRate = uVar2;
      *(VkBaseInStructure **)&(this->features).fragment_shading_rate.attachmentFragmentShadingRate =
           base[1].pNext;
      (this->features).fragment_shading_rate.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_LOCAL_READ_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).dynamic_rendering_local_read.sType = base->sType;
      *(undefined4 *)&(this->features).dynamic_rendering_local_read.field_0x4 = uVar2;
      (this->features).dynamic_rendering_local_read.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead = base[1].sType;
      *(undefined4 *)&(this->features).dynamic_rendering_local_read.field_0x14 = uVar2;
      (this->features).dynamic_rendering_local_read.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_IMAGE_ATOMIC_INT64_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_image_atomic_int64.sType = base->sType;
      *(undefined4 *)&(this->features).shader_image_atomic_int64.field_0x4 = uVar2;
      (this->features).shader_image_atomic_int64.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_image_atomic_int64.shaderImageInt64Atomics = base[1].sType;
      (this->features).shader_image_atomic_int64.sparseImageInt64Atomics = uVar2;
      (this->features).shader_image_atomic_int64.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_QUAD_CONTROL_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_quad_control.sType = base->sType;
      *(undefined4 *)&(this->features).shader_quad_control.field_0x4 = uVar2;
      (this->features).shader_quad_control.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_quad_control.shaderQuadControl = base[1].sType;
      *(undefined4 *)&(this->features).shader_quad_control.field_0x14 = uVar2;
      (this->features).shader_quad_control.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SEPARATE_DEPTH_STENCIL_LAYOUTS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).separate_ds_layout.sType = base->sType;
      *(undefined4 *)&(this->features).separate_ds_layout.field_0x4 = uVar2;
      (this->features).separate_ds_layout.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).separate_ds_layout.separateDepthStencilLayouts = base[1].sType;
      *(undefined4 *)&(this->features).separate_ds_layout.field_0x14 = uVar2;
      (this->features).separate_ds_layout.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_ADDRESS_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).buffer_device_address_ext.sType = base->sType;
      *(undefined4 *)&(this->features).buffer_device_address_ext.field_0x4 = uVar2;
      (this->features).buffer_device_address_ext.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).buffer_device_address_ext.bufferDeviceAddress = base[1].sType;
      (this->features).buffer_device_address_ext.bufferDeviceAddressCaptureReplay = uVar2;
      *(VkBaseInStructure **)
       &(this->features).buffer_device_address_ext.bufferDeviceAddressMultiDevice = base[1].pNext;
      (this->features).buffer_device_address_ext.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COOPERATIVE_MATRIX_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).cooperative_matrix_nv.sType = base->sType;
      *(undefined4 *)&(this->features).cooperative_matrix_nv.field_0x4 = uVar2;
      (this->features).cooperative_matrix_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).cooperative_matrix_nv.cooperativeMatrix = base[1].sType;
      (this->features).cooperative_matrix_nv.cooperativeMatrixRobustBufferAccess = uVar2;
      (this->features).cooperative_matrix_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADER_INTERLOCK_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_interlock.sType = base->sType;
      *(undefined4 *)&(this->features).shader_interlock.field_0x4 = uVar2;
      (this->features).shader_interlock.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_interlock.fragmentShaderSampleInterlock = base[1].sType;
      (this->features).shader_interlock.fragmentShaderPixelInterlock = uVar2;
      *(VkBaseInStructure **)&(this->features).shader_interlock.fragmentShaderShadingRateInterlock =
           base[1].pNext;
      (this->features).shader_interlock.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_UNIFORM_BUFFER_STANDARD_LAYOUT_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).ubo_standard_layout.sType = base->sType;
      *(undefined4 *)&(this->features).ubo_standard_layout.field_0x4 = uVar2;
      (this->features).ubo_standard_layout.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).ubo_standard_layout.uniformBufferStandardLayout = base[1].sType;
      *(undefined4 *)&(this->features).ubo_standard_layout.field_0x14 = uVar2;
      (this->features).ubo_standard_layout.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROVOKING_VERTEX_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).provoking_vertex.sType = base->sType;
      *(undefined4 *)&(this->features).provoking_vertex.field_0x4 = uVar2;
      (this->features).provoking_vertex.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).provoking_vertex.provokingVertexLast = base[1].sType;
      (this->features).provoking_vertex.transformFeedbackPreservesProvokingVertex = uVar2;
      (this->features).provoking_vertex.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).buffer_device_address.sType = base->sType;
      *(undefined4 *)&(this->features).buffer_device_address.field_0x4 = uVar2;
      (this->features).buffer_device_address.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).buffer_device_address.bufferDeviceAddress = base[1].sType;
      (this->features).buffer_device_address.bufferDeviceAddressCaptureReplay = uVar2;
      *(VkBaseInStructure **)&(this->features).buffer_device_address.bufferDeviceAddressMultiDevice
           = base[1].pNext;
      (this->features).buffer_device_address.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_LINE_RASTERIZATION_FEATURES) {
      memcpy(&(this->features).line_rasterization,base,0x28);
      (this->features).line_rasterization.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_FLOAT_FEATURES_EXT) {
      memcpy(&(this->features).shader_atomic_float,base,0x40);
      (this->features).shader_atomic_float.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).extended_dynamic_state.sType = base->sType;
      *(undefined4 *)&(this->features).extended_dynamic_state.field_0x4 = uVar2;
      (this->features).extended_dynamic_state.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).extended_dynamic_state.extendedDynamicState = base[1].sType;
      *(undefined4 *)&(this->features).extended_dynamic_state.field_0x14 = uVar2;
      (this->features).extended_dynamic_state.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_FLOAT_2_FEATURES_EXT) {
      memcpy(&(this->features).shader_atomic_float2,base,0x40);
      (this->features).shader_atomic_float2.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_DEMOTE_TO_HELPER_INVOCATION_FEATURES)
    {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).demote_to_helper.sType = base->sType;
      *(undefined4 *)&(this->features).demote_to_helper.field_0x4 = uVar2;
      (this->features).demote_to_helper.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).demote_to_helper.shaderDemoteToHelperInvocation = base[1].sType;
      *(undefined4 *)&(this->features).demote_to_helper.field_0x14 = uVar2;
      (this->features).demote_to_helper.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).device_generated_commands_nv.sType = base->sType;
      *(undefined4 *)&(this->features).device_generated_commands_nv.field_0x4 = uVar2;
      (this->features).device_generated_commands_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).device_generated_commands_nv.deviceGeneratedCommands = base[1].sType;
      *(undefined4 *)&(this->features).device_generated_commands_nv.field_0x14 = uVar2;
      (this->features).device_generated_commands_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_INTEGER_DOT_PRODUCT_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_integer_dot_product.sType = base->sType;
      *(undefined4 *)&(this->features).shader_integer_dot_product.field_0x4 = uVar2;
      (this->features).shader_integer_dot_product.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_integer_dot_product.shaderIntegerDotProduct = base[1].sType;
      *(undefined4 *)&(this->features).shader_integer_dot_product.field_0x14 = uVar2;
      (this->features).shader_integer_dot_product.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_BIAS_CONTROL_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).depth_bias_control.sType = base->sType;
      *(undefined4 *)&(this->features).depth_bias_control.field_0x4 = uVar2;
      (this->features).depth_bias_control.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).depth_bias_control.depthBiasControl = base[1].sType;
      (this->features).depth_bias_control.leastRepresentableValueForceUnormRepresentation = uVar2;
      *(VkBaseInStructure **)&(this->features).depth_bias_control.floatRepresentation =
           base[1].pNext;
      (this->features).depth_bias_control.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).robustness2.sType = base->sType;
      *(undefined4 *)&(this->features).robustness2.field_0x4 = uVar2;
      (this->features).robustness2.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).robustness2.robustBufferAccess2 = base[1].sType;
      (this->features).robustness2.robustImageAccess2 = uVar2;
      *(VkBaseInStructure **)&(this->features).robustness2.nullDescriptor = base[1].pNext;
      (this->features).robustness2.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_CUSTOM_BORDER_COLOR_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).custom_border_color.sType = base->sType;
      *(undefined4 *)&(this->features).custom_border_color.field_0x4 = uVar2;
      (this->features).custom_border_color.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).custom_border_color.customBorderColors = base[1].sType;
      (this->features).custom_border_color.customBorderColorWithoutFormat = uVar2;
      (this->features).custom_border_color.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SYNCHRONIZATION_2_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).synchronization2.sType = base->sType;
      *(undefined4 *)&(this->features).synchronization2.field_0x4 = uVar2;
      (this->features).synchronization2.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).synchronization2.synchronization2 = base[1].sType;
      *(undefined4 *)&(this->features).synchronization2.field_0x14 = uVar2;
      (this->features).synchronization2.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).descriptor_buffer.sType = base->sType;
      *(undefined4 *)&(this->features).descriptor_buffer.field_0x4 = uVar2;
      (this->features).descriptor_buffer.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).descriptor_buffer.descriptorBuffer = base[1].sType;
      (this->features).descriptor_buffer.descriptorBufferCaptureReplay = uVar2;
      *(VkBaseInStructure **)&(this->features).descriptor_buffer.descriptorBufferImageLayoutIgnored
           = base[1].pNext;
      (this->features).descriptor_buffer.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_GRAPHICS_PIPELINE_LIBRARY_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).graphics_pipeline_library.sType = base->sType;
      *(undefined4 *)&(this->features).graphics_pipeline_library.field_0x4 = uVar2;
      (this->features).graphics_pipeline_library.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).graphics_pipeline_library.graphicsPipelineLibrary = base[1].sType;
      *(undefined4 *)&(this->features).graphics_pipeline_library.field_0x14 = uVar2;
      (this->features).graphics_pipeline_library.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ZERO_INITIALIZE_WORKGROUP_MEMORY_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).zero_initialize_workgroup_memory.sType = base->sType;
      *(undefined4 *)&(this->features).zero_initialize_workgroup_memory.field_0x4 = uVar2;
      (this->features).zero_initialize_workgroup_memory.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).zero_initialize_workgroup_memory.shaderZeroInitializeWorkgroupMemory =
           base[1].sType;
      *(undefined4 *)&(this->features).zero_initialize_workgroup_memory.field_0x14 = uVar2;
      (this->features).zero_initialize_workgroup_memory.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).fragment_shading_rate_enums.sType = base->sType;
      *(undefined4 *)&(this->features).fragment_shading_rate_enums.field_0x4 = uVar2;
      (this->features).fragment_shading_rate_enums.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).fragment_shading_rate_enums.fragmentShadingRateEnums = base[1].sType;
      (this->features).fragment_shading_rate_enums.supersampleFragmentShadingRates = uVar2;
      *(VkBaseInStructure **)
       &(this->features).fragment_shading_rate_enums.noInvocationFragmentShadingRates =
           base[1].pNext;
      (this->features).fragment_shading_rate_enums.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_MOTION_BLUR_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).ray_tracing_motion_blur_nv.sType = base->sType;
      *(undefined4 *)&(this->features).ray_tracing_motion_blur_nv.field_0x4 = uVar2;
      (this->features).ray_tracing_motion_blur_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur = base[1].sType;
      (this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlurPipelineTraceRaysIndirect =
           uVar2;
      (this->features).ray_tracing_motion_blur_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
      memcpy(&(this->features).mesh_shader,base,0x28);
      (this->features).mesh_shader.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).image_robustness.sType = base->sType;
      *(undefined4 *)&(this->features).image_robustness.field_0x4 = uVar2;
      (this->features).image_robustness.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).image_robustness.robustImageAccess = base[1].sType;
      *(undefined4 *)&(this->features).image_robustness.field_0x14 = uVar2;
      (this->features).image_robustness.pNext = (void *)0x0;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_WORKGROUP_MEMORY_EXPLICIT_LAYOUT_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).workgroup_memory_explicit_layout.sType = base->sType;
      *(undefined4 *)&(this->features).workgroup_memory_explicit_layout.field_0x4 = uVar2;
      (this->features).workgroup_memory_explicit_layout.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout =
           base[1].sType;
      (this->features).workgroup_memory_explicit_layout.
      workgroupMemoryExplicitLayoutScalarBlockLayout = uVar2;
      *(VkBaseInStructure **)
       &(this->features).workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout8BitAccess =
           base[1].pNext;
      (this->features).workgroup_memory_explicit_layout.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ATTACHMENT_FEEDBACK_LOOP_LAYOUT_FEATURES_EXT
            ) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).attachment_feedback_loop_layout.sType = base->sType;
      *(undefined4 *)&(this->features).attachment_feedback_loop_layout.field_0x4 = uVar2;
      (this->features).attachment_feedback_loop_layout.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).attachment_feedback_loop_layout.attachmentFeedbackLoopLayout = base[1].sType;
      *(undefined4 *)&(this->features).attachment_feedback_loop_layout.field_0x14 = uVar2;
      (this->features).attachment_feedback_loop_layout.pNext = (void *)0x0;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_FEATURES_ARM) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).rasterization_order_attachment_access.sType = base->sType;
      *(undefined4 *)&(this->features).rasterization_order_attachment_access.field_0x4 = uVar2;
      (this->features).rasterization_order_attachment_access.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).rasterization_order_attachment_access.rasterizationOrderColorAttachmentAccess
           = base[1].sType;
      (this->features).rasterization_order_attachment_access.rasterizationOrderDepthAttachmentAccess
           = uVar2;
      *(VkBaseInStructure **)
       &(this->features).rasterization_order_attachment_access.
        rasterizationOrderStencilAttachmentAccess = base[1].pNext;
      (this->features).rasterization_order_attachment_access.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_PIPELINE_FEATURES_KHR) {
      memcpy(&(this->features).ray_tracing_pipeline,base,0x28);
      (this->features).ray_tracing_pipeline.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_QUERY_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).ray_query.sType = base->sType;
      *(undefined4 *)&(this->features).ray_query.field_0x4 = uVar2;
      (this->features).ray_query.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).ray_query.rayQuery = base[1].sType;
      *(undefined4 *)&(this->features).ray_query.field_0x14 = uVar2;
      (this->features).ray_query.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).mutable_descriptor_type.sType = base->sType;
      *(undefined4 *)&(this->features).mutable_descriptor_type.field_0x4 = uVar2;
      (this->features).mutable_descriptor_type.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).mutable_descriptor_type.mutableDescriptorType = base[1].sType;
      *(undefined4 *)&(this->features).mutable_descriptor_type.field_0x14 = uVar2;
      (this->features).mutable_descriptor_type.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_INPUT_DYNAMIC_STATE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).vertex_input_dynamic_state.sType = base->sType;
      *(undefined4 *)&(this->features).vertex_input_dynamic_state.field_0x4 = uVar2;
      (this->features).vertex_input_dynamic_state.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).vertex_input_dynamic_state.vertexInputDynamicState = base[1].sType;
      *(undefined4 *)&(this->features).vertex_input_dynamic_state.field_0x14 = uVar2;
      (this->features).vertex_input_dynamic_state.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLIP_CONTROL_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).depth_clip_control.sType = base->sType;
      *(undefined4 *)&(this->features).depth_clip_control.field_0x4 = uVar2;
      (this->features).depth_clip_control.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).depth_clip_control.depthClipControl = base[1].sType;
      *(undefined4 *)&(this->features).depth_clip_control.field_0x14 = uVar2;
      (this->features).depth_clip_control.pNext = (void *)0x0;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).multisampled_render_to_single_sampled.sType = base->sType;
      *(undefined4 *)&(this->features).multisampled_render_to_single_sampled.field_0x4 = uVar2;
      (this->features).multisampled_render_to_single_sampled.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).multisampled_render_to_single_sampled.multisampledRenderToSingleSampled =
           base[1].sType;
      *(undefined4 *)&(this->features).multisampled_render_to_single_sampled.field_0x14 = uVar2;
      (this->features).multisampled_render_to_single_sampled.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_2_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).extended_dynamic_state2.sType = base->sType;
      *(undefined4 *)&(this->features).extended_dynamic_state2.field_0x4 = uVar2;
      (this->features).extended_dynamic_state2.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).extended_dynamic_state2.extendedDynamicState2 = base[1].sType;
      (this->features).extended_dynamic_state2.extendedDynamicState2LogicOp = uVar2;
      *(VkBaseInStructure **)
       &(this->features).extended_dynamic_state2.extendedDynamicState2PatchControlPoints =
           base[1].pNext;
      (this->features).extended_dynamic_state2.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COLOR_WRITE_ENABLE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).color_write_enable.sType = base->sType;
      *(undefined4 *)&(this->features).color_write_enable.field_0x4 = uVar2;
      (this->features).color_write_enable.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).color_write_enable.colorWriteEnable = base[1].sType;
      *(undefined4 *)&(this->features).color_write_enable.field_0x14 = uVar2;
      (this->features).color_write_enable.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).primitives_generated_query.sType = base->sType;
      *(undefined4 *)&(this->features).primitives_generated_query.field_0x4 = uVar2;
      (this->features).primitives_generated_query.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).primitives_generated_query.primitivesGeneratedQuery = base[1].sType;
      (this->features).primitives_generated_query.primitivesGeneratedQueryWithRasterizerDiscard =
           uVar2;
      *(VkBaseInStructure **)
       &(this->features).primitives_generated_query.primitivesGeneratedQueryWithNonZeroStreams =
           base[1].pNext;
      (this->features).primitives_generated_query.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_MAINTENANCE_1_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).ray_tracing_maintenance1.sType = base->sType;
      *(undefined4 *)&(this->features).ray_tracing_maintenance1.field_0x4 = uVar2;
      (this->features).ray_tracing_maintenance1.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).ray_tracing_maintenance1.rayTracingMaintenance1 = base[1].sType;
      (this->features).ray_tracing_maintenance1.rayTracingPipelineTraceRaysIndirect2 = uVar2;
      (this->features).ray_tracing_maintenance1.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).image_2d_view_of_3d.sType = base->sType;
      *(undefined4 *)&(this->features).image_2d_view_of_3d.field_0x4 = uVar2;
      (this->features).image_2d_view_of_3d.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).image_2d_view_of_3d.image2DViewOf3D = base[1].sType;
      (this->features).image_2d_view_of_3d.sampler2DViewOf3D = uVar2;
      (this->features).image_2d_view_of_3d.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_TILE_IMAGE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_tile_image.sType = base->sType;
      *(undefined4 *)&(this->features).shader_tile_image.field_0x4 = uVar2;
      (this->features).shader_tile_image.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_tile_image.shaderTileImageColorReadAccess = base[1].sType;
      (this->features).shader_tile_image.shaderTileImageDepthReadAccess = uVar2;
      *(VkBaseInStructure **)&(this->features).shader_tile_image.shaderTileImageStencilReadAccess =
           base[1].pNext;
      (this->features).shader_tile_image.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_OPACITY_MICROMAP_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).opacity_micromap.sType = base->sType;
      *(undefined4 *)&(this->features).opacity_micromap.field_0x4 = uVar2;
      (this->features).opacity_micromap.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).opacity_micromap.micromap = base[1].sType;
      (this->features).opacity_micromap.micromapCaptureReplay = uVar2;
      *(VkBaseInStructure **)&(this->features).opacity_micromap.micromapHostCommands = base[1].pNext
      ;
      (this->features).opacity_micromap.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BORDER_COLOR_SWIZZLE_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).border_color_swizzle.sType = base->sType;
      *(undefined4 *)&(this->features).border_color_swizzle.field_0x4 = uVar2;
      (this->features).border_color_swizzle.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).border_color_swizzle.borderColorSwizzle = base[1].sType;
      (this->features).border_color_swizzle.borderColorSwizzleFromImage = uVar2;
      (this->features).border_color_swizzle.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_4_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).maintenance4.sType = base->sType;
      *(undefined4 *)&(this->features).maintenance4.field_0x4 = uVar2;
      (this->features).maintenance4.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).maintenance4.maintenance4 = base[1].sType;
      *(undefined4 *)&(this->features).maintenance4.field_0x14 = uVar2;
      (this->features).maintenance4.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SUBGROUP_ROTATE_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_subgroup_rotate.sType = base->sType;
      *(undefined4 *)&(this->features).shader_subgroup_rotate.field_0x4 = uVar2;
      (this->features).shader_subgroup_rotate.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_subgroup_rotate.shaderSubgroupRotate = base[1].sType;
      (this->features).shader_subgroup_rotate.shaderSubgroupRotateClustered = uVar2;
      (this->features).shader_subgroup_rotate.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_NON_SEAMLESS_CUBE_MAP_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).non_seamless_cube_map.sType = base->sType;
      *(undefined4 *)&(this->features).non_seamless_cube_map.field_0x4 = uVar2;
      (this->features).non_seamless_cube_map.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).non_seamless_cube_map.nonSeamlessCubeMap = base[1].sType;
      *(undefined4 *)&(this->features).non_seamless_cube_map.field_0x14 = uVar2;
      (this->features).non_seamless_cube_map.pNext = (void *)0x0;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_COMPUTE_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).device_generated_commands_compute_nv.sType = base->sType;
      *(undefined4 *)&(this->features).device_generated_commands_compute_nv.field_0x4 = uVar2;
      (this->features).device_generated_commands_compute_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).device_generated_commands_compute_nv.deviceGeneratedCompute = base[1].sType;
      (this->features).device_generated_commands_compute_nv.deviceGeneratedComputePipelines = uVar2;
      *(VkBaseInStructure **)
       &(this->features).device_generated_commands_compute_nv.deviceGeneratedComputeCaptureReplay =
           base[1].pNext;
      (this->features).device_generated_commands_compute_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_PROCESSING_FEATURES_QCOM) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).image_processing_qcom.sType = base->sType;
      *(undefined4 *)&(this->features).image_processing_qcom.field_0x4 = uVar2;
      (this->features).image_processing_qcom.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).image_processing_qcom.textureSampleWeighted = base[1].sType;
      (this->features).image_processing_qcom.textureBoxFilter = uVar2;
      *(VkBaseInStructure **)&(this->features).image_processing_qcom.textureBlockMatch =
           base[1].pNext;
      (this->features).image_processing_qcom.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_3_FEATURES_EXT) {
      memcpy(&(this->features).extended_dynamic_state3,base,0x90);
      (this->features).extended_dynamic_state3.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBPASS_MERGE_FEEDBACK_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).subpass_merge_feedback.sType = base->sType;
      *(undefined4 *)&(this->features).subpass_merge_feedback.field_0x4 = uVar2;
      (this->features).subpass_merge_feedback.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).subpass_merge_feedback.subpassMergeFeedback = base[1].sType;
      *(undefined4 *)&(this->features).subpass_merge_feedback.field_0x14 = uVar2;
      (this->features).subpass_merge_feedback.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_module_identifier.sType = base->sType;
      *(undefined4 *)&(this->features).shader_module_identifier.field_0x4 = uVar2;
      (this->features).shader_module_identifier.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_module_identifier.shaderModuleIdentifier = base[1].sType;
      *(undefined4 *)&(this->features).shader_module_identifier.field_0x14 = uVar2;
      (this->features).shader_module_identifier.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_OPTICAL_FLOW_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).optical_flow_nv.sType = base->sType;
      *(undefined4 *)&(this->features).optical_flow_nv.field_0x4 = uVar2;
      (this->features).optical_flow_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).optical_flow_nv.opticalFlow = base[1].sType;
      *(undefined4 *)&(this->features).optical_flow_nv.field_0x14 = uVar2;
      (this->features).optical_flow_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_LEGACY_DITHERING_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).legacy_dithering.sType = base->sType;
      *(undefined4 *)&(this->features).legacy_dithering.field_0x4 = uVar2;
      (this->features).legacy_dithering.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).legacy_dithering.legacyDithering = base[1].sType;
      *(undefined4 *)&(this->features).legacy_dithering.field_0x14 = uVar2;
      (this->features).legacy_dithering.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_PROTECTED_ACCESS_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).pipeline_protected_access.sType = base->sType;
      *(undefined4 *)&(this->features).pipeline_protected_access.field_0x4 = uVar2;
      (this->features).pipeline_protected_access.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).pipeline_protected_access.pipelineProtectedAccess = base[1].sType;
      *(undefined4 *)&(this->features).pipeline_protected_access.field_0x14 = uVar2;
      (this->features).pipeline_protected_access.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_5_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).maintenance5.sType = base->sType;
      *(undefined4 *)&(this->features).maintenance5.field_0x4 = uVar2;
      (this->features).maintenance5.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).maintenance5.maintenance5 = base[1].sType;
      *(undefined4 *)&(this->features).maintenance5.field_0x14 = uVar2;
      (this->features).maintenance5.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_POSITION_FETCH_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).ray_tracing_position_fetch.sType = base->sType;
      *(undefined4 *)&(this->features).ray_tracing_position_fetch.field_0x4 = uVar2;
      (this->features).ray_tracing_position_fetch.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).ray_tracing_position_fetch.rayTracingPositionFetch = base[1].sType;
      *(undefined4 *)&(this->features).ray_tracing_position_fetch.field_0x14 = uVar2;
      (this->features).ray_tracing_position_fetch.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_object.sType = base->sType;
      *(undefined4 *)&(this->features).shader_object.field_0x4 = uVar2;
      (this->features).shader_object.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_object.shaderObject = base[1].sType;
      *(undefined4 *)&(this->features).shader_object.field_0x14 = uVar2;
      (this->features).shader_object.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_CORE_BUILTINS_FEATURES_ARM) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_core_builtins_arm.sType = base->sType;
      *(undefined4 *)&(this->features).shader_core_builtins_arm.field_0x4 = uVar2;
      (this->features).shader_core_builtins_arm.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_core_builtins_arm.shaderCoreBuiltins = base[1].sType;
      *(undefined4 *)&(this->features).shader_core_builtins_arm.field_0x14 = uVar2;
      (this->features).shader_core_builtins_arm.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COOPERATIVE_MATRIX_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).cooperative_matrix.sType = base->sType;
      *(undefined4 *)&(this->features).cooperative_matrix.field_0x4 = uVar2;
      (this->features).cooperative_matrix.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).cooperative_matrix.cooperativeMatrix = base[1].sType;
      (this->features).cooperative_matrix.cooperativeMatrixRobustBufferAccess = uVar2;
      (this->features).cooperative_matrix.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PER_STAGE_DESCRIPTOR_SET_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).per_stage_descriptor_set_nv.sType = base->sType;
      *(undefined4 *)&(this->features).per_stage_descriptor_set_nv.field_0x4 = uVar2;
      (this->features).per_stage_descriptor_set_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).per_stage_descriptor_set_nv.perStageDescriptorSet = base[1].sType;
      (this->features).per_stage_descriptor_set_nv.dynamicPipelineLayout = uVar2;
      (this->features).per_stage_descriptor_set_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_PROCESSING_2_FEATURES_QCOM) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).image_processing2_qcom.sType = base->sType;
      *(undefined4 *)&(this->features).image_processing2_qcom.field_0x4 = uVar2;
      (this->features).image_processing2_qcom.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).image_processing2_qcom.textureBlockMatch2 = base[1].sType;
      *(undefined4 *)&(this->features).image_processing2_qcom.field_0x14 = uVar2;
      (this->features).image_processing2_qcom.pNext = (void *)0x0;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ATTACHMENT_FEEDBACK_LOOP_DYNAMIC_STATE_FEATURES_EXT)
    {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).attachment_feedback_loop_dynamic_state.sType = base->sType;
      *(undefined4 *)&(this->features).attachment_feedback_loop_dynamic_state.field_0x4 = uVar2;
      (this->features).attachment_feedback_loop_dynamic_state.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).attachment_feedback_loop_dynamic_state.attachmentFeedbackLoopDynamicState =
           base[1].sType;
      *(undefined4 *)&(this->features).attachment_feedback_loop_dynamic_state.field_0x14 = uVar2;
      (this->features).attachment_feedback_loop_dynamic_state.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_FLOAT_CONTROLS_2_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_float_controls2.sType = base->sType;
      *(undefined4 *)&(this->features).shader_float_controls2.field_0x4 = uVar2;
      (this->features).shader_float_controls2.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_float_controls2.shaderFloatControls2 = base[1].sType;
      *(undefined4 *)&(this->features).shader_float_controls2.field_0x14 = uVar2;
      (this->features).shader_float_controls2.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_EXPECT_ASSUME_FEATURES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).expect_assume.sType = base->sType;
      *(undefined4 *)&(this->features).expect_assume.field_0x4 = uVar2;
      (this->features).expect_assume.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).expect_assume.shaderExpectAssume = base[1].sType;
      *(undefined4 *)&(this->features).expect_assume.field_0x14 = uVar2;
      (this->features).expect_assume.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAW_ACCESS_CHAINS_FEATURES_NV) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).raw_access_chains_nv.sType = base->sType;
      *(undefined4 *)&(this->features).raw_access_chains_nv.field_0x4 = uVar2;
      (this->features).raw_access_chains_nv.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).raw_access_chains_nv.shaderRawAccessChains = base[1].sType;
      *(undefined4 *)&(this->features).raw_access_chains_nv.field_0x14 = uVar2;
      (this->features).raw_access_chains_nv.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_7_FEATURES_KHR) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).maintenance7.sType = base->sType;
      *(undefined4 *)&(this->features).maintenance7.field_0x4 = uVar2;
      (this->features).maintenance7.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).maintenance7.maintenance7 = base[1].sType;
      *(undefined4 *)&(this->features).maintenance7.field_0x14 = uVar2;
      (this->features).maintenance7.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_REPLICATED_COMPOSITES_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).shader_replicated_composites.sType = base->sType;
      *(undefined4 *)&(this->features).shader_replicated_composites.field_0x4 = uVar2;
      (this->features).shader_replicated_composites.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).shader_replicated_composites.shaderReplicatedComposites = base[1].sType;
      *(undefined4 *)&(this->features).shader_replicated_composites.field_0x14 = uVar2;
      (this->features).shader_replicated_composites.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).device_generated_commands.sType = base->sType;
      *(undefined4 *)&(this->features).device_generated_commands.field_0x4 = uVar2;
      (this->features).device_generated_commands.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).device_generated_commands.deviceGeneratedCommands = base[1].sType;
      (this->features).device_generated_commands.dynamicGeneratedPipelineLayout = uVar2;
      (this->features).device_generated_commands.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLAMP_CONTROL_FEATURES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->features).depth_clamp_control.sType = base->sType;
      *(undefined4 *)&(this->features).depth_clamp_control.field_0x4 = uVar2;
      (this->features).depth_clamp_control.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->features).depth_clamp_control.depthClampControl = base[1].sType;
      *(undefined4 *)&(this->features).depth_clamp_control.field_0x14 = uVar2;
      (this->features).depth_clamp_control.pNext = (void *)0x0;
    }
  }
  return;
}

Assistant:

void FeatureFilter::Impl::init_features(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

#define F(struct_type, member, ...) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES: \
		memcpy(&features.member, base, sizeof(features.member)); \
		features.member.pNext = nullptr; \
		break

#define FE(struct_type, member, ext) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext: \
		memcpy(&features.member, base, sizeof(features.member)); \
		features.member.pNext = nullptr; \
		break

#define FE_ALIAS(struct_type, member, ext, ext_alias) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext: \
		memcpy(&features.member, base, sizeof(features.member)); \
		features.member.pNext = nullptr; \
		break

#define FEATURE(struct_name, core_struct, feature) if (core_struct.feature) features.struct_name.feature = VK_TRUE
		switch (base->sType)
		{
#include "fossilize_feature_filter_features.inc"
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_FEATURES:
		{
			auto &vk11 = *reinterpret_cast<const VkPhysicalDeviceVulkan11Features *>(base);
			FEATURE(storage_16bit, vk11, storageBuffer16BitAccess);
			FEATURE(storage_16bit, vk11, uniformAndStorageBuffer16BitAccess);
			FEATURE(storage_16bit, vk11, storagePushConstant16);
			FEATURE(storage_16bit, vk11, storageInputOutput16);
			FEATURE(multiview, vk11, multiview);
			FEATURE(multiview, vk11, multiviewGeometryShader);
			FEATURE(multiview, vk11, multiviewTessellationShader);
			FEATURE(variable_pointers, vk11, variablePointersStorageBuffer);
			FEATURE(variable_pointers, vk11, variablePointers);
			// protected memory
			FEATURE(ycbcr_conversion, vk11, samplerYcbcrConversion);
			FEATURE(draw_parameters, vk11, shaderDrawParameters);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES:
		{
			auto &vk12 = *reinterpret_cast<const VkPhysicalDeviceVulkan12Features *>(base);
			//samplerMirrorClampToEdge
			//drawIndirectCount
			FEATURE(storage_8bit, vk12, storageBuffer8BitAccess);
			FEATURE(storage_8bit, vk12, uniformAndStorageBuffer8BitAccess);
			FEATURE(storage_8bit, vk12, storagePushConstant8);
			FEATURE(atomic_int64, vk12, shaderBufferInt64Atomics);
			FEATURE(atomic_int64, vk12, shaderSharedInt64Atomics);
			FEATURE(float16_int8, vk12, shaderFloat16);
			FEATURE(float16_int8, vk12, shaderInt8);
			FEATURE(vk12, vk12, descriptorIndexing);
			FEATURE(descriptor_indexing, vk12, shaderInputAttachmentArrayDynamicIndexing);
			FEATURE(descriptor_indexing, vk12, shaderUniformTexelBufferArrayDynamicIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageTexelBufferArrayDynamicIndexing);
			FEATURE(descriptor_indexing, vk12, shaderUniformBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderSampledImageArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageImageArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderInputAttachmentArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderUniformTexelBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageTexelBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, descriptorBindingUniformBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingSampledImageUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingStorageImageUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingStorageBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingUniformTexelBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingStorageTexelBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingUpdateUnusedWhilePending);
			FEATURE(descriptor_indexing, vk12, descriptorBindingPartiallyBound);
			FEATURE(descriptor_indexing, vk12, descriptorBindingVariableDescriptorCount);
			FEATURE(descriptor_indexing, vk12, runtimeDescriptorArray);
			FEATURE(vk12, vk12, samplerFilterMinmax);
			FEATURE(vk12, vk12, scalarBlockLayout);
			//imagelessFramebuffer;
			//uniformBufferStandardLayout;
			FEATURE(subgroup_extended_types, vk12, shaderSubgroupExtendedTypes);
			FEATURE(separate_ds_layout, vk12, separateDepthStencilLayouts);
			//hostQueryReset;
			//timelineSemaphore;
			FEATURE(buffer_device_address, vk12, bufferDeviceAddress);
			FEATURE(buffer_device_address, vk12, bufferDeviceAddressCaptureReplay);
			FEATURE(buffer_device_address, vk12, bufferDeviceAddressMultiDevice);
			FEATURE(memory_model, vk12, vulkanMemoryModel);
			FEATURE(memory_model, vk12, vulkanMemoryModelDeviceScope);
			FEATURE(memory_model, vk12, vulkanMemoryModelAvailabilityVisibilityChains);
			FEATURE(vk12, vk12, shaderOutputViewportIndex);
			FEATURE(vk12, vk12, shaderOutputLayer);
			//subgroupBroadcastDynamicId;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES:
		{
			auto &vk13 = *reinterpret_cast<const VkPhysicalDeviceVulkan13Features *>(base);
			FEATURE(image_robustness, vk13, robustImageAccess);
			FEATURE(inline_uniform_block, vk13, inlineUniformBlock);
			FEATURE(inline_uniform_block, vk13, descriptorBindingInlineUniformBlockUpdateAfterBind);
			//pipelineCreationCacheControl;
			//privateData;
			FEATURE(demote_to_helper, vk13, shaderDemoteToHelperInvocation);
			FEATURE(vk13, vk13, shaderTerminateInvocation);
			FEATURE(subgroup_size_control, vk13, subgroupSizeControl);
			FEATURE(subgroup_size_control, vk13, computeFullSubgroups);
			FEATURE(synchronization2, vk13, synchronization2);
			//textureCompressionASTC_HDR;
			FEATURE(zero_initialize_workgroup_memory, vk13, shaderZeroInitializeWorkgroupMemory);
			FEATURE(dynamic_rendering, vk13, dynamicRendering);
			FEATURE(shader_integer_dot_product, vk13, shaderIntegerDotProduct);
			FEATURE(maintenance4, vk13, maintenance4);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_4_FEATURES:
		{
			auto &vk14 = *reinterpret_cast<const VkPhysicalDeviceVulkan14Features *>(base);
			FEATURE(dynamic_rendering_local_read, vk14, dynamicRenderingLocalRead);
			FEATURE(shader_subgroup_rotate, vk14, shaderSubgroupRotate);
			FEATURE(shader_subgroup_rotate, vk14, shaderSubgroupRotateClustered);
			FEATURE(shader_float_controls2, vk14, shaderFloatControls2);
			FEATURE(expect_assume, vk14, shaderExpectAssume);
			FEATURE(line_rasterization, vk14, rectangularLines);
			FEATURE(line_rasterization, vk14, bresenhamLines);
			FEATURE(line_rasterization, vk14, smoothLines);
			FEATURE(line_rasterization, vk14, stippledRectangularLines);
			FEATURE(line_rasterization, vk14, stippledBresenhamLines);
			FEATURE(line_rasterization, vk14, stippledSmoothLines);
			FEATURE(attribute_divisor, vk14, vertexAttributeInstanceRateDivisor);
			FEATURE(attribute_divisor, vk14, vertexAttributeInstanceRateZeroDivisor);
			FEATURE(maintenance5, vk14, maintenance5);
			FEATURE(pipeline_protected_access, vk14, pipelineProtectedAccess);
			FEATURE(pipeline_robustness, vk14, pipelineRobustness);
			FEATURE(vk14, vk14, pushDescriptor);
			break;
		}

		default:
			break;
		}

#undef F
#undef FE
#undef FE_ALIAS
#undef FEATURE

		pNext = base->pNext;
	}
}